

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzline.h
# Opt level: O3

void pztopology::TPZLine::ComputeHCurlDirections<double>
               (TPZFMatrix<double> *gradx,TPZFMatrix<double> *directions,
               TPZVec<int> *transformationIds)

{
  long lVar1;
  double *pdVar2;
  double dVar3;
  
  dVar3 = (double)(int)(-(uint)(*transformationIds->fStore != 0) | 1) * 0.5;
  lVar1 = (directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
  if ((lVar1 < 1) || ((directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
    TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  pdVar2 = directions->fElem;
  *pdVar2 = dVar3;
  if ((0 < lVar1) && (1 < (directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol)) {
    pdVar2[lVar1] = dVar3;
    if ((0 < lVar1) && (2 < (directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol)) {
      pdVar2[lVar1 * 2] = dVar3;
      return;
    }
    TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
  pzinternal::DebugStopImpl
            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h",
             0x26d);
}

Assistant:

static constexpr MElementType Type() {return EOned;}